

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O0

void __thiscall
icu_63::CollationSettings::setStrength
          (CollationSettings *this,int32_t value,int32_t defaultOptions,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int32_t noStrength;
  UErrorCode *errorCode_local;
  int32_t defaultOptions_local;
  int32_t value_local;
  CollationSettings *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    uVar2 = this->options & 0xffff0fff;
    if (value == -1) {
      this->options = uVar2 | defaultOptions & 0xf000U;
    }
    else if (((uint)value < 4) || (value == 0xf)) {
      this->options = uVar2 | value << 0xc;
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

void
CollationSettings::setStrength(int32_t value, int32_t defaultOptions, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    int32_t noStrength = options & ~STRENGTH_MASK;
    switch(value) {
    case UCOL_PRIMARY:
    case UCOL_SECONDARY:
    case UCOL_TERTIARY:
    case UCOL_QUATERNARY:
    case UCOL_IDENTICAL:
        options = noStrength | (value << STRENGTH_SHIFT);
        break;
    case UCOL_DEFAULT:
        options = noStrength | (defaultOptions & STRENGTH_MASK);
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        break;
    }
}